

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,
               VkPipelineColorBlendAdvancedStateCreateInfoEXT *create_info,
               DynamicStateInfo *dynamic_state_info)

{
  DynamicStateInfo *dynamic_state_info_local;
  VkPipelineColorBlendAdvancedStateCreateInfoEXT *create_info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
     ((dynamic_state_info->color_blend_advanced & 1U) == 0)) {
    Hasher::u32(h,create_info->srcPremultiplied);
    Hasher::u32(h,create_info->dstPremultiplied);
    Hasher::u32(h,create_info->blendOverlap);
  }
  else {
    Hasher::u32(h,0);
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkPipelineColorBlendAdvancedStateCreateInfoEXT &create_info,
                              const DynamicStateInfo *dynamic_state_info)
{
	if (dynamic_state_info && dynamic_state_info->color_blend_advanced)
	{
		h.u32(0);
	}
	else
	{
		h.u32(create_info.srcPremultiplied);
		h.u32(create_info.dstPremultiplied);
		h.u32(create_info.blendOverlap);
	}
}